

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::delegateSizeHintChanged(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  QAbstractItemView *object;
  ulong uVar1;
  QFlags_conflict1 *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  undefined4 in_stack_ffffffffffffff88;
  CheckIndexOption in_stack_ffffffffffffff8c;
  QAbstractItemModel *this_00;
  undefined8 in_stack_ffffffffffffff98;
  ConnectionType type;
  char local_30 [40];
  long local_8;
  
  type = (ConnectionType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  object = q_func(in_RDI);
  if (in_RDI->model != (QAbstractItemModel *)0x0) {
    this_00 = in_RDI->model;
    QFlags<QAbstractItemModel::CheckIndexOption>::QFlags
              ((QFlags<QAbstractItemModel::CheckIndexOption> *)this_00,in_stack_ffffffffffffff8c);
    uVar1 = QAbstractItemModel::checkIndex((QModelIndex *)this_00,in_RSI);
    if ((uVar1 & 1) == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)in_RSI,(int)((ulong)this_00 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QMessageLogger::warning
                (local_30,
                 "Delegate size hint changed for a model index that does not belong to this view");
    }
    type = (ConnectionType)((ulong)in_RSI >> 0x20);
  }
  QMetaObject::invokeMethod<void(QAbstractItemView::*)()>
            (object,(offset_in_QAbstractItemView_to_subr *)in_RDI,type);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::delegateSizeHintChanged(const QModelIndex &index)
{
    Q_Q(QAbstractItemView);
    if (model) {
        if (!model->checkIndex(index))
            qWarning("Delegate size hint changed for a model index that does not belong to this view");
    }
    QMetaObject::invokeMethod(q, &QAbstractItemView::doItemsLayout, Qt::QueuedConnection);
}